

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adfa.cc
# Opt level: O1

void __thiscall
re2c::DFA::DFA(DFA *this,dfa_t *dfa,vector<unsigned_long,_std::allocator<unsigned_long>_> *fill,
              Skeleton *skel,charset_t *charset,string *n,string *c,uint32_t l)

{
  pointer pcVar1;
  pointer ppdVar2;
  pointer ppdVar3;
  ulong uVar4;
  dfa_state_t *pdVar5;
  State *pSVar6;
  size_t *psVar7;
  pointer puVar8;
  size_t sVar9;
  label_t lVar10;
  void *pvVar11;
  uint32_t *puVar12;
  State **ppSVar13;
  Span *pSVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  State *pSVar20;
  uint uVar21;
  
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->accepts).elems.
  super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->skeleton = skel;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + n->_M_string_length);
  (this->cond)._M_dataplus._M_p = (pointer)&(this->cond).field_2;
  pcVar1 = (c->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->cond,pcVar1,pcVar1 + c->_M_string_length);
  this->line = l;
  this->lbChar = 0;
  this->ubChar = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish[-1];
  *(undefined8 *)&this->nStates = 0;
  *(undefined8 *)((long)&this->head + 4) = 0;
  *(undefined8 *)((long)&this->max_fill + 3) = 0;
  ppdVar2 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppdVar3 = (dfa->states).
            super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  uVar15 = (long)ppdVar3 - (long)ppdVar2 >> 3;
  uVar4 = dfa->nchars;
  pvVar11 = operator_new__(-(ulong)(uVar15 >> 0x3d != 0) | (long)ppdVar3 - (long)ppdVar2);
  if (ppdVar3 != ppdVar2) {
    lVar16 = 0;
    do {
      puVar12 = (uint32_t *)operator_new(0x58);
      lVar10 = label_t::first();
      *puVar12 = lVar10.value;
      puVar12[2] = 0;
      puVar12[3] = 0;
      puVar12[4] = 0;
      puVar12[5] = 0;
      *(undefined8 *)((long)puVar12 + 0x12) = 0;
      *(undefined8 *)((long)puVar12 + 0x1a) = 0;
      Go::Go((Go *)(puVar12 + 10));
      puVar12[0x12] = 0;
      puVar12[0x14] = 0;
      puVar12[0x15] = 0;
      *(uint32_t **)((long)pvVar11 + lVar16 * 8) = puVar12;
      lVar16 = lVar16 + 1;
    } while (uVar15 + (uVar15 == 0) != lVar16);
  }
  ppSVar13 = &this->head;
  if (ppdVar3 != ppdVar2) {
    lVar16 = 0;
    do {
      pdVar5 = (dfa->states).
               super__Vector_base<re2c::dfa_state_t_*,_std::allocator<re2c::dfa_state_t_*>_>._M_impl
               .super__Vector_impl_data._M_start[lVar16];
      pSVar6 = *(State **)((long)pvVar11 + lVar16 * 8);
      this->nStates = this->nStates + 1;
      *ppSVar13 = pSVar6;
      pSVar6->isPreCtxt = pdVar5->ctx;
      pSVar6->rule = pdVar5->rule;
      pSVar6->fill = (fill->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar16];
      pSVar14 = (Span *)operator_new(uVar4 << 4);
      (pSVar6->go).span = pSVar14;
      if (uVar4 == 0) {
        uVar17 = 0;
      }
      else {
        psVar7 = pdVar5->arcs;
        puVar8 = (charset->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar19 = 0;
        uVar21 = 0;
        uVar18 = 0;
        do {
          sVar9 = psVar7[uVar19];
          do {
            uVar21 = uVar21 + 1;
            uVar19 = (ulong)uVar21;
            if (uVar4 <= uVar19) break;
          } while (psVar7[uVar19] == sVar9);
          if (sVar9 == 0xffffffffffffffff) {
            pSVar20 = (State *)0x0;
          }
          else {
            pSVar20 = *(State **)((long)pvVar11 + sVar9 * 8);
          }
          pSVar14[uVar18].to = pSVar20;
          pSVar14[uVar18].ub = puVar8[uVar19];
          uVar17 = (int)uVar18 + 1;
          uVar18 = (ulong)uVar17;
        } while (uVar19 < uVar4);
      }
      (pSVar6->go).nSpans = uVar17;
      ppSVar13 = &pSVar6->next;
      lVar16 = lVar16 + 1;
    } while (lVar16 != uVar15 + (uVar15 == 0));
  }
  *ppSVar13 = (State *)0x0;
  operator_delete__(pvVar11);
  return;
}

Assistant:

DFA::DFA
	( const dfa_t &dfa
	, const std::vector<size_t> &fill
	, Skeleton *skel
	, const charset_t &charset
	, const std::string &n
	, const std::string &c
	, uint32_t l
	)
	: accepts ()
	, skeleton (skel)
	, name (n)
	, cond (c)
	, line (l)
	, lbChar(0)
	, ubChar(charset.back())
	, nStates(0)
	, head(NULL)

	// statistics
	, max_fill (0)
	, need_backup (false)
	, need_backupctx (false)
	, need_accept (false)
{
	const size_t nstates = dfa.states.size();
	const size_t nchars = dfa.nchars;

	State **i2s = new State*[nstates];
	for (size_t i = 0; i < nstates; ++i)
	{
		i2s[i] = new State;
	}

	State **p = &head;
	for (size_t i = 0; i < nstates; ++i)
	{
		dfa_state_t *t = dfa.states[i];
		State *s = i2s[i];

		++nStates;
		*p = s;
		p = &s->next;

		s->isPreCtxt = t->ctx;
		s->rule = t->rule;
		s->fill = fill[i];
		s->go.span = allocate<Span>(nchars);
		uint32_t j = 0;
		for (uint32_t c = 0; c < nchars; ++j)
		{
			const size_t to = t->arcs[c];
			for (;++c < nchars && t->arcs[c] == to;);
			s->go.span[j].to = to == dfa_t::NIL ? NULL : i2s[to];
			s->go.span[j].ub = charset[c];
		}
		s->go.nSpans = j;
	}
	*p = NULL;

	delete[] i2s;
}